

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

bool IsArguments(ParseNode *pnode)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ParseNodeName *pPVar4;
  ParseNodeCall *pPVar5;
  ParseNodeArrLit *pPVar6;
  ParseNodeTri *pPVar7;
  ParseNodeUni *pPVar8;
  undefined4 *puVar9;
  ParseNodeBin *pPVar10;
  bool local_41;
  ParseNodeBin *pnodeBin;
  ParseNodeUni *pnodeUni;
  ParseNodePtr pPStack_20;
  uint flags;
  ParseNode *pnodeArg;
  ParseNode *pnode_local;
  
  pnodeArg = pnode;
  do {
    switch(pnodeArg->nop) {
    case knopName:
      pPVar4 = ParseNode::AsParseNodeName(pnodeArg);
      local_41 = false;
      if (pPVar4->sym != (Symbol *)0x0) {
        pPVar4 = ParseNode::AsParseNodeName(pnodeArg);
        local_41 = Symbol::IsArguments(pPVar4->sym);
      }
      return local_41;
    default:
      uVar3 = ParseNode::Grfnop((uint)pnodeArg->nop);
      if ((uVar3 & 4) == 0) {
        if ((uVar3 & 8) == 0) {
          return false;
        }
        pPVar10 = ParseNode::AsParseNodeBin(pnodeArg);
        if ((pPVar10->pnode1 == (ParseNodePtr)0x0) || (pPVar10->pnode2 == (ParseNodePtr)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xeb,"(pnodeBin->pnode1 && pnodeBin->pnode2)",
                             "pnodeBin->pnode1 && pnodeBin->pnode2");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        bVar2 = IsArguments(pPVar10->pnode1);
        if (bVar2) {
          return true;
        }
        pnodeArg = pPVar10->pnode2;
      }
      else {
        pPVar8 = ParseNode::AsParseNodeUni(pnodeArg);
        if (pPVar8->pnode1 == (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xe3,"(pnodeUni->pnode1)","pnodeUni->pnode1");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pnodeArg = pPVar8->pnode1;
      }
      break;
    case knopTypeof:
    case knopObject:
    case knopList:
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
    case knopFncDecl:
    case knopClassDecl:
    case knopFor:
    case knopIf:
    case knopWhile:
    case knopDoWhile:
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
    case knopBlock:
    case knopWith:
    case knopBreak:
    case knopContinue:
    case knopTryCatch:
    case knopReturn:
    case knopTry:
    case knopThrow:
    case knopFinally:
    case knopTryFinally:
    case knopObjectPattern:
    case knopArrayPattern:
    case knopParamPattern:
      return true;
    case knopArray:
      pPVar6 = ParseNode::AsParseNodeArrLit(pnodeArg);
      if ((((byte)pPVar6->field_0x20 >> 2 & 1) != 0) ||
         (pPVar6 = ParseNode::AsParseNodeArrLit(pnodeArg), pPVar6->count == 0)) {
        return false;
      }
      pPVar8 = ParseNode::AsParseNodeUni(pnodeArg);
      pnodeArg = pPVar8->pnode1;
      break;
    case knopCall:
    case knopNew:
      pPVar5 = ParseNode::AsParseNodeCall(pnodeArg);
      bVar2 = IsArguments(pPVar5->pnodeTarget);
      if (bVar2) {
        return true;
      }
      pPVar5 = ParseNode::AsParseNodeCall(pnodeArg);
      if (pPVar5->pnodeArgs == (ParseNodePtr)0x0) {
        return false;
      }
      pPVar5 = ParseNode::AsParseNodeCall(pnodeArg);
      pPStack_20 = pPVar5->pnodeArgs;
      while (pPStack_20->nop == knopList) {
        pPVar10 = ParseNode::AsParseNodeBin(pPStack_20);
        bVar2 = IsArguments(pPVar10->pnode1);
        if (bVar2) {
          return true;
        }
        pPVar10 = ParseNode::AsParseNodeBin(pPStack_20);
        pPStack_20 = pPVar10->pnode2;
      }
      pnodeArg = pPStack_20;
      break;
    case knopQmark:
      pPVar7 = ParseNode::AsParseNodeTri(pnodeArg);
      bVar2 = IsArguments(pPVar7->pnode1);
      if (bVar2) {
        return true;
      }
      pPVar7 = ParseNode::AsParseNodeTri(pnodeArg);
      bVar2 = IsArguments(pPVar7->pnode2);
      if (bVar2) {
        return true;
      }
      pPVar7 = ParseNode::AsParseNodeTri(pnodeArg);
      pnodeArg = pPVar7->pnode3;
    }
  } while( true );
}

Assistant:

bool IsArguments(ParseNode *pnode)
{
    for (;;)
    {
        switch (pnode->nop)
        {
        case knopName:
            return pnode->AsParseNodeName()->sym && pnode->AsParseNodeName()->sym->IsArguments();

        case knopCall:
        case knopNew:
            if (IsArguments(pnode->AsParseNodeCall()->pnodeTarget))
            {
                return true;
            }

            if (pnode->AsParseNodeCall()->pnodeArgs)
            {
                ParseNode *pnodeArg = pnode->AsParseNodeCall()->pnodeArgs;
                while (pnodeArg->nop == knopList)
                {
                    if (IsArguments(pnodeArg->AsParseNodeBin()->pnode1))
                        return true;

                    pnodeArg = pnodeArg->AsParseNodeBin()->pnode2;
                }

                pnode = pnodeArg;
                break;
            }

            return false;

        case knopArray:
            if (pnode->AsParseNodeArrLit()->arrayOfNumbers || pnode->AsParseNodeArrLit()->count == 0)
            {
                return false;
            }

            pnode = pnode->AsParseNodeUni()->pnode1;
            break;

        case knopQmark:
            if (IsArguments(pnode->AsParseNodeTri()->pnode1) || IsArguments(pnode->AsParseNodeTri()->pnode2))
            {
                return true;
            }

            pnode = pnode->AsParseNodeTri()->pnode3;
            break;

            //
            // Cases where we don't check for "arguments" yet.
            // Assume that they might have it. Disable the optimization in such scenarios
            //
        case knopList:
        case knopObject:
        case knopVarDecl:
        case knopConstDecl:
        case knopLetDecl:
        case knopFncDecl:
        case knopClassDecl:
        case knopFor:
        case knopIf:
        case knopDoWhile:
        case knopWhile:
        case knopForIn:
        case knopForOf:
        case knopForAwaitOf:
        case knopReturn:
        case knopBlock:
        case knopBreak:
        case knopContinue:
        case knopTypeof:
        case knopThrow:
        case knopWith:
        case knopFinally:
        case knopTry:
        case knopTryCatch:
        case knopTryFinally:
        case knopArrayPattern:
        case knopObjectPattern:
        case knopParamPattern:
            return true;

        default:
        {
            uint flags = ParseNode::Grfnop(pnode->nop);
            if (flags&fnopUni)
            {
                ParseNodeUni * pnodeUni = pnode->AsParseNodeUni();
                Assert(pnodeUni->pnode1);

                pnode = pnodeUni->pnode1;
                break;
            }
            else if (flags&fnopBin)
            {
                ParseNodeBin * pnodeBin = pnode->AsParseNodeBin();
                Assert(pnodeBin->pnode1 && pnodeBin->pnode2);

                if (IsArguments(pnodeBin->pnode1))
                {
                    return true;
                }

                pnode = pnodeBin->pnode2;
                break;
            }

            return false;
        }

        }
    }
}